

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::LabelForField_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  bool bVar1;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  local_18 = (FieldDescriptor *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  bVar1 = FieldDescriptor::is_required((FieldDescriptor *)this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"required",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    bVar1 = FieldDescriptor::is_repeated(local_18);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"repeated",local_2d);
      std::allocator<char>::~allocator(local_2d);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"optional",&local_2e);
      std::allocator<char>::~allocator(&local_2e);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LabelForField(const FieldDescriptor* field) {
  if (field->is_required()) {
    return "required";
  } else if (field->is_repeated()) {
    return "repeated";
  } else {
    return "optional";
  }
}